

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt.c
# Opt level: O0

void mqstate(Curl_easy *data,mqttstate state,mqttstate nextstate)

{
  connectdata *pcVar1;
  mqtt_conn *mqtt;
  connectdata *conn;
  mqttstate nextstate_local;
  mqttstate state_local;
  Curl_easy *data_local;
  
  pcVar1 = data->conn;
  (pcVar1->proto).mqtt.state = state;
  if (state == MQTT_FIRST) {
    (pcVar1->proto).mqtt.nextstate = nextstate;
  }
  return;
}

Assistant:

static void mqstate(struct Curl_easy *data,
                    enum mqttstate state,
                    enum mqttstate nextstate) /* used if state == FIRST */
{
  struct connectdata *conn = data->conn;
  struct mqtt_conn *mqtt = &conn->proto.mqtt;
#ifdef DEBUGBUILD
  infof(data, "%s (from %s) (next is %s)",
        statenames[state],
        statenames[mqtt->state],
        (state == MQTT_FIRST) ? statenames[nextstate] : "");
#endif
  mqtt->state = state;
  if(state == MQTT_FIRST)
    mqtt->nextstate = nextstate;
}